

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed>
::~SmallVectorImpl(SmallVectorImpl<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed>
                   *this)

{
  undefined1 *__ptr;
  
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
          ).
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
          .super_SmallVectorBase.BeginX;
  if ((U *)__ptr !=
      &(this->
       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_false>
       ).
       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<112U,_Fixpp::Type::String>_>::Unparsed,_void>
       .FirstEl) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }